

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

objnum bif_get_optional_obj_arg(bifcxdef *ctx,int *rem_argc)

{
  long lVar1;
  int *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined2 local_2;
  
  if (*in_RSI == 0) {
    local_2 = 0xffff;
  }
  else if ((*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x02') ||
          (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x05')) {
    *in_RSI = *in_RSI + -1;
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) == '\x02') {
      local_2 = *(objnum *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    }
    else {
      if (**(char **)(*(long *)(in_RDI + 8) + 0x20) != '\x05') {
        *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
        runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffdc);
      }
      local_2 = 0xffff;
    }
  }
  else {
    local_2 = 0xffff;
  }
  return local_2;
}

Assistant:

static objnum bif_get_optional_obj_arg(bifcxdef *ctx, int *rem_argc)
{
    /* if we're out of arguments, there's no object value */
    if (*rem_argc == 0)
        return MCMONINV;

    /* 
     *   if the next argument is not an object or nil, we're out of object
     *   arguments 
     */
    if (runtostyp(ctx->bifcxrun) != DAT_OBJECT
        && runtostyp(ctx->bifcxrun) != DAT_NIL)
        return MCMONINV;

    /* we have an object - remove it from the remaining argument count */
    --(*rem_argc);

    /* pop and return the object value */
    return runpopobjnil(ctx->bifcxrun);
}